

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O0

bool llvm::consumeUnsignedInteger(StringRef *Str,uint Radix,unsigned_long_long *Result)

{
  ulong uVar1;
  char cVar2;
  unsigned_long *puVar3;
  char *pcVar4;
  unsigned_long_long PrevResult;
  undefined1 auStack_a0 [4];
  uint CharVal;
  StringRef Str2;
  unsigned_long_long *Result_local;
  uint Radix_local;
  StringRef *Str_local;
  unsigned_long local_60 [3];
  undefined1 *local_48;
  undefined1 local_40 [16];
  undefined1 *local_30;
  StringRef *local_28;
  char *local_20;
  char *local_18;
  undefined1 *local_10;
  
  Str2.Length = (size_t)Result;
  Result_local._4_4_ = Radix;
  if (Radix == 0) {
    Result_local._4_4_ = GetAutoSenseRadix(Str);
  }
  if (Str->Length == 0) {
    Str_local._7_1_ = true;
  }
  else {
    _auStack_a0 = Str->Data;
    Str2.Data = (char *)Str->Length;
    *(undefined8 *)Str2.Length = 0;
    local_28 = Str;
    while (local_30 = auStack_a0, Str2.Data != (char *)0x0) {
      cVar2 = StringRef::operator[]((StringRef *)auStack_a0,0);
      if ((cVar2 < '0') || (cVar2 = StringRef::operator[]((StringRef *)auStack_a0,0), '9' < cVar2))
      {
        cVar2 = StringRef::operator[]((StringRef *)auStack_a0,0);
        if ((cVar2 < 'a') || (cVar2 = StringRef::operator[]((StringRef *)auStack_a0,0), 'z' < cVar2)
           ) {
          cVar2 = StringRef::operator[]((StringRef *)auStack_a0,0);
          if ((cVar2 < 'A') ||
             (cVar2 = StringRef::operator[]((StringRef *)auStack_a0,0), 'Z' < cVar2)) break;
          cVar2 = StringRef::operator[]((StringRef *)auStack_a0,0);
          PrevResult._4_4_ = (int)cVar2 - 0x37;
        }
        else {
          cVar2 = StringRef::operator[]((StringRef *)auStack_a0,0);
          PrevResult._4_4_ = (int)cVar2 - 0x57;
        }
      }
      else {
        cVar2 = StringRef::operator[]((StringRef *)auStack_a0,0);
        PrevResult._4_4_ = (int)cVar2 - 0x30;
      }
      if (Result_local._4_4_ <= PrevResult._4_4_) break;
      uVar1 = *(ulong *)Str2.Length;
      *(ulong *)Str2.Length =
           *(long *)Str2.Length * (ulong)Result_local._4_4_ + (ulong)PrevResult._4_4_;
      if (*(ulong *)Str2.Length / (ulong)Result_local._4_4_ < uVar1) {
        return true;
      }
      local_48 = auStack_a0;
      local_60[2] = 1;
      local_60[1] = 0xffffffffffffffff;
      puVar3 = std::min<unsigned_long>(local_60 + 2,(unsigned_long *)&Str2);
      local_60[2] = *puVar3;
      pcVar4 = _auStack_a0 + local_60[2];
      local_60[0] = (long)Str2.Data - local_60[2];
      puVar3 = std::min<unsigned_long>(local_60 + 1,local_60);
      local_10 = local_40;
      Str2.Data = (char *)*puVar3;
      _auStack_a0 = pcVar4;
      local_20 = Str2.Data;
      local_18 = pcVar4;
    }
    if ((char *)Str->Length == Str2.Data) {
      Str_local._7_1_ = true;
    }
    else {
      Str->Data = _auStack_a0;
      Str->Length = (size_t)Str2.Data;
      Str_local._7_1_ = false;
    }
  }
  return Str_local._7_1_;
}

Assistant:

bool llvm::consumeUnsignedInteger(StringRef &Str, unsigned Radix,
                                  unsigned long long &Result) {
  // Autosense radix if not specified.
  if (Radix == 0)
    Radix = GetAutoSenseRadix(Str);

  // Empty strings (after the radix autosense) are invalid.
  if (Str.empty()) return true;

  // Parse all the bytes of the string given this radix.  Watch for overflow.
  StringRef Str2 = Str;
  Result = 0;
  while (!Str2.empty()) {
    unsigned CharVal;
    if (Str2[0] >= '0' && Str2[0] <= '9')
      CharVal = Str2[0] - '0';
    else if (Str2[0] >= 'a' && Str2[0] <= 'z')
      CharVal = Str2[0] - 'a' + 10;
    else if (Str2[0] >= 'A' && Str2[0] <= 'Z')
      CharVal = Str2[0] - 'A' + 10;
    else
      break;

    // If the parsed value is larger than the integer radix, we cannot
    // consume any more characters.
    if (CharVal >= Radix)
      break;

    // Add in this character.
    unsigned long long PrevResult = Result;
    Result = Result * Radix + CharVal;

    // Check for overflow by shifting back and seeing if bits were lost.
    if (Result / Radix < PrevResult)
      return true;

    Str2 = Str2.substr(1);
  }

  // We consider the operation a failure if no characters were consumed
  // successfully.
  if (Str.size() == Str2.size())
    return true;

  Str = Str2;
  return false;
}